

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PA4Application.cpp
# Opt level: O0

void __thiscall PA4Application::RenderObject::loadWavefront(RenderObject *this,string *objname)

{
  vector<SimpleMaterial,_std::allocator<SimpleMaterial>_> *this_00;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *__x;
  VAO *this_01;
  element_type *peVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar2;
  size_type sVar3;
  const_reference pvVar4;
  Texture *this_02;
  element_type *this_03;
  pointer pSVar5;
  int local_248 [4];
  shared_ptr<Texture> local_238;
  shared_ptr<Program> local_228;
  shared_ptr<VAO> local_218;
  RenderObjectPart local_208;
  undefined1 local_1c8 [8];
  shared_ptr<Texture> texture;
  Image<unsigned_char> colorMap;
  SimpleMaterial *material;
  undefined1 local_188 [8];
  shared_ptr<VAO> vaoSlave;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *ibo;
  size_t k;
  size_t nbParts;
  shared_ptr<VAO> vao;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  *vertexUVs;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  vextexPositions;
  vector<SimpleMaterial,_std::allocator<SimpleMaterial>_> *materials;
  ObjLoader objLoader;
  string *objname_local;
  RenderObject *this_local;
  
  objLoader.m_materials.super__Vector_base<SimpleMaterial,_std::allocator<SimpleMaterial>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)objname;
  ObjLoader::ObjLoader((ObjLoader *)&materials,objname);
  this_00 = ObjLoader::materials((ObjLoader *)&materials);
  __x = ObjLoader::vertexPositions((ObjLoader *)&materials);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            *)&vertexUVs,__x);
  vao.super___shared_ptr<VAO,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ObjLoader::vertexUVs((ObjLoader *)&materials)
  ;
  this_01 = (VAO *)operator_new(0x48);
  VAO::VAO(this_01,2);
  std::shared_ptr<VAO>::shared_ptr<VAO,void>((shared_ptr<VAO> *)&nbParts,this_01);
  peVar1 = std::__shared_ptr_access<VAO,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<VAO,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)&nbParts
                     );
  VAO::setVBO<glm::vec<3,float,(glm::qualifier)0>>
            (peVar1,0,(vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                       *)&vertexUVs);
  peVar1 = std::__shared_ptr_access<VAO,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<VAO,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)&nbParts
                     );
  VAO::setVBO<glm::vec<2,float,(glm::qualifier)0>>
            (peVar1,1,(vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                       *)vao.super___shared_ptr<VAO,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  pvVar2 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
           ObjLoader::nbIBOs((ObjLoader *)&materials);
  for (ibo = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0; ibo < pvVar2;
      ibo = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
            ((long)&(ibo->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_start + 1)) {
    vaoSlave.super___shared_ptr<VAO,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ObjLoader::ibo((ObjLoader *)&materials,(uint)ibo);
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       vaoSlave.super___shared_ptr<VAO,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi);
    if (sVar3 != 0) {
      std::shared_ptr<VAO>::shared_ptr((shared_ptr<VAO> *)local_188);
      std::__shared_ptr_access<VAO,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<VAO,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)&nbParts);
      VAO::makeSlaveVAO((VAO *)&material);
      std::shared_ptr<VAO>::operator=((shared_ptr<VAO> *)local_188,(shared_ptr<VAO> *)&material);
      std::shared_ptr<VAO>::~shared_ptr((shared_ptr<VAO> *)&material);
      peVar1 = std::__shared_ptr_access<VAO,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<VAO,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_188);
      VAO::setIBO<unsigned_int>
                (peVar1,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        vaoSlave.super___shared_ptr<VAO,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi);
      pvVar4 = std::vector<SimpleMaterial,_std::allocator<SimpleMaterial>_>::operator[]
                         (this_00,(size_type)ibo);
      ObjLoader::image((Image<unsigned_char> *)
                       &texture.super___shared_ptr<Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                       (ObjLoader *)&materials,&pvVar4->diffuseTexName);
      this_02 = (Texture *)operator_new(0x10);
      Texture::Texture(this_02,0xde1);
      std::shared_ptr<Texture>::shared_ptr<Texture,void>((shared_ptr<Texture> *)local_1c8,this_02);
      this_03 = std::__shared_ptr_access<Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                           )local_1c8);
      Texture::setData<unsigned_char>
                (this_03,(Image<unsigned_char> *)
                         &texture.super___shared_ptr<Texture,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,false);
      std::shared_ptr<VAO>::shared_ptr(&local_218,(shared_ptr<VAO> *)local_188);
      std::shared_ptr<Program>::shared_ptr(&local_228,&this->m_program);
      std::shared_ptr<Texture>::shared_ptr(&local_238,(shared_ptr<Texture> *)local_1c8);
      RenderObjectPart::RenderObjectPart
                (&local_208,&local_218,&local_228,&pvVar4->diffuse,&local_238);
      std::
      vector<PA4Application::RenderObjectPart,_std::allocator<PA4Application::RenderObjectPart>_>::
      push_back(&this->m_parts,&local_208);
      RenderObjectPart::~RenderObjectPart(&local_208);
      std::shared_ptr<Texture>::~shared_ptr(&local_238);
      std::shared_ptr<Program>::~shared_ptr(&local_228);
      std::shared_ptr<VAO>::~shared_ptr(&local_218);
      std::shared_ptr<Texture>::~shared_ptr((shared_ptr<Texture> *)local_1c8);
      std::shared_ptr<VAO>::~shared_ptr((shared_ptr<VAO> *)local_188);
    }
  }
  pSVar5 = std::unique_ptr<Sampler,_std::default_delete<Sampler>_>::operator->(&this->m_colormap);
  local_248[3] = 0x2601;
  Sampler::setParameter<int>(pSVar5,0x2801,local_248 + 3);
  pSVar5 = std::unique_ptr<Sampler,_std::default_delete<Sampler>_>::operator->(&this->m_colormap);
  local_248[2] = 0x2600;
  Sampler::setParameter<int>(pSVar5,0x2800,local_248 + 2);
  pSVar5 = std::unique_ptr<Sampler,_std::default_delete<Sampler>_>::operator->(&this->m_colormap);
  local_248[1] = 0x2901;
  Sampler::setParameter<int>(pSVar5,0x2802,local_248 + 1);
  pSVar5 = std::unique_ptr<Sampler,_std::default_delete<Sampler>_>::operator->(&this->m_colormap);
  local_248[0] = 0x2901;
  Sampler::setParameter<int>(pSVar5,0x2803,local_248);
  std::shared_ptr<VAO>::~shared_ptr((shared_ptr<VAO> *)&nbParts);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             *)&vertexUVs);
  ObjLoader::~ObjLoader((ObjLoader *)&materials);
  return;
}

Assistant:

void PA4Application::RenderObject::loadWavefront(const std::string & objname)
{
  ObjLoader objLoader(objname);
  const std::vector<SimpleMaterial> & materials = objLoader.materials();
  std::vector<glm::vec3> vextexPositions = objLoader.vertexPositions();
  const std::vector<glm::vec2> & vertexUVs = objLoader.vertexUVs();
  // set up the VBOs of the master VAO
  std::shared_ptr<VAO> vao(new VAO(2));
  vao->setVBO(0, vextexPositions);
  vao->setVBO(1, vertexUVs);
  size_t nbParts = objLoader.nbIBOs();
  for (size_t k = 0; k < nbParts; k++) {
    const std::vector<uint> & ibo = objLoader.ibo(k);
    if (ibo.size() == 0) {
      continue;
    }
    std::shared_ptr<VAO> vaoSlave;
    vaoSlave = vao->makeSlaveVAO();
    vaoSlave->setIBO(ibo);
    const SimpleMaterial & material = materials[k];
    Image<> colorMap = objLoader.image(material.diffuseTexName);
    std::shared_ptr<Texture> texture(new Texture(GL_TEXTURE_2D));
    texture->setData(colorMap);
    m_parts.push_back(RenderObjectPart(vaoSlave, m_program, material.diffuse, texture));
  }
  m_colormap->setParameter(GL_TEXTURE_MIN_FILTER, GL_LINEAR);
  m_colormap->setParameter(GL_TEXTURE_MAG_FILTER, GL_NEAREST);
  m_colormap->setParameter(GL_TEXTURE_WRAP_S, GL_REPEAT);
  m_colormap->setParameter(GL_TEXTURE_WRAP_T, GL_REPEAT);
}